

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<ns::book_const&>::operator!=
          (result *__return_storage_ptr__,expression_lhs<ns::book_const&> *this,book *rhs)

{
  lest *this_00;
  bool bVar1;
  book *in_R8;
  allocator local_69;
  string local_68;
  
  bVar1 = ns::operator!=(*(book **)this,rhs);
  this_00 = *(lest **)this;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,"!=",&local_69);
  to_string<ns::book,ns::book>
            (&local_68,this_00,(book *)&stack0xffffffffffffffb8,&rhs->author,in_R8);
  __return_storage_ptr__->passed = bVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_68)
  ;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  return __return_storage_ptr__;
}

Assistant:

result operator==( R const & rhs ) { return result{ lhs == rhs, to_string( lhs, "==", rhs ) }; }